

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void R_InterpolateView(player_t *player,double Frac,InterpolationViewer *iview)

{
  uint uVar1;
  instance *piVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  subsector_t *psVar7;
  DVector3a *pDVar8;
  TVector2<double> *pTVar9;
  bool bVar10;
  DAngle *pDVar11;
  double *pdVar12;
  uint i;
  uint uVar13;
  DVector3a *pDVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 in_XMM0_Dc;
  undefined4 uVar17;
  undefined4 in_XMM0_Dd;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  DAngle DVar22;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  DAngle local_e0;
  undefined1 local_d8 [16];
  TVector3<double> local_c8;
  double local_b0;
  double local_a8;
  player_t *local_a0;
  InterpolationViewer *local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined1 local_78 [16];
  double local_68;
  DAngle DStack_60;
  DVector3a local_58;
  
  local_d8._8_4_ = in_XMM0_Dc;
  local_d8._0_8_ = Frac;
  local_d8._12_4_ = in_XMM0_Dd;
  if (NoInterpolateView) {
    TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
    NoInterpolateView = false;
    InterpolationViewer::instance::operator=(&iview->Old,&iview->New);
  }
  local_78._0_8_ = (iview->Old).Pos.X;
  local_78._8_8_ = (iview->Old).Pos.Y;
  psVar7 = R_PointInSubsector((DVector2 *)local_78);
  iVar6 = psVar7->sector->PortalGroup;
  local_78._0_8_ = (iview->New).Pos.X;
  local_78._8_8_ = (iview->New).Pos.Y;
  psVar7 = R_PointInSubsector((DVector2 *)local_78);
  local_100 = (iview->Old).Angles.Yaw.Degrees;
  local_f8 = (iview->New).Angles.Yaw.Degrees;
  if (cl_capfps.Value == false) {
    iVar5 = psVar7->sector->PortalGroup;
    dVar21 = (iview->Old).Pos.X;
    local_78._0_8_ = (iview->New).Pos.X;
    if ((dVar21 != (double)local_78._0_8_) || (NAN(dVar21) || NAN((double)local_78._0_8_))) {
LAB_004701df:
      if (InterpolationPath.Count != 0) {
        if (r_showviewer == false) {
          local_a8 = (iview->Old).Pos.Z;
          local_b0 = (iview->New).Pos.Z;
          local_58.pos.Y = (iview->Old).Pos.Y;
          local_80 = 0.0;
          local_e0.Degrees = 0.0;
          local_78._8_8_ = (iview->New).Pos.Y;
          local_68 = 0.0;
          DStack_60.Degrees = 0.0;
          local_a0 = player;
          local_98 = iview;
          local_58.pos.X = dVar21;
          TArray<DVector3a,_DVector3a>::Push(&InterpolationPath,(DVector3a *)local_78);
          local_e8 = 0.0;
          local_f0 = 0.0;
          local_108 = 0.0;
          for (uVar13 = 0; uVar13 < InterpolationPath.Count; uVar13 = uVar13 + 2) {
            uVar1 = uVar13 - 1;
            pdVar12 = &InterpolationPath.Array[uVar1].pos.Z;
            if (uVar13 == 0) {
              pdVar12 = &local_80;
            }
            pDVar11 = &InterpolationPath.Array[uVar1].angle;
            if (uVar13 == 0) {
              pDVar11 = &local_e0;
            }
            pDVar8 = InterpolationPath.Array + uVar1;
            if (uVar13 == 0) {
              pDVar8 = &local_58;
            }
            local_c8.Z = InterpolationPath.Array[uVar13].pos.Z - *pdVar12;
            local_c8.X = InterpolationPath.Array[uVar13].pos.X - (pDVar8->pos).X;
            local_c8.Y = InterpolationPath.Array[uVar13].pos.Y - (pDVar8->pos).Y;
            dVar21 = TVector3<double>::Length(&local_c8);
            local_f0 = local_f0 + *pdVar12;
            local_108 = local_108 + dVar21;
            local_e8 = local_e8 + pDVar11->Degrees;
          }
          dVar21 = local_108 * (double)local_d8._0_8_;
          dVar19 = 0.0;
          dVar20 = 0.0;
          DVar22.Degrees = 0.0;
          for (uVar13 = 0; pDVar8 = InterpolationPath.Array, uVar13 < InterpolationPath.Count;
              uVar13 = uVar13 + 2) {
            uVar1 = uVar13 - 1;
            pdVar12 = &InterpolationPath.Array[uVar1].pos.Z;
            if (uVar13 == 0) {
              pdVar12 = &local_80;
            }
            pDVar11 = &InterpolationPath.Array[uVar1].angle;
            if (uVar13 == 0) {
              pDVar11 = &local_e0;
            }
            pDVar14 = InterpolationPath.Array + uVar1;
            if (uVar13 == 0) {
              pDVar14 = &local_58;
            }
            local_c8.Z = InterpolationPath.Array[uVar13].pos.Z - *pdVar12;
            local_90 = dVar20;
            local_c8.X = InterpolationPath.Array[uVar13].pos.X - (pDVar14->pos).X;
            local_c8.Y = InterpolationPath.Array[uVar13].pos.Y - (pDVar14->pos).Y;
            local_88 = dVar19;
            local_58.pos.Z = dVar21;
            local_58.angle.Degrees = DVar22.Degrees;
            dVar21 = TVector3<double>::Length(&local_c8);
            dVar20 = local_90 + *pdVar12;
            dVar19 = local_88 + pDVar11->Degrees;
            if (local_58.pos.Z < dVar21) {
              local_100 = local_100 + dVar19;
              local_f8 = local_f8 - (local_e8 - dVar19);
              ViewPos.Z = ((local_b0 - (local_f0 - dVar20)) - (local_a8 + dVar20)) *
                          (double)local_d8._0_8_ + local_a8 + dVar20;
              dVar20 = (pDVar14->pos).X;
              dVar19 = (pDVar14->pos).Y;
              ViewPos.Y = (local_58.pos.Z / dVar21) * (pDVar8[uVar13].pos.Y - dVar19) + dVar19;
              ViewPos.X = (local_58.pos.Z / dVar21) * (pDVar8[uVar13].pos.X - dVar20) + dVar20;
              break;
            }
            dVar21 = local_58.pos.Z - dVar21;
            DVar22.Degrees = local_58.angle.Degrees;
          }
          iview = local_98;
          player = local_a0;
          if (InterpolationPath.Count != 0) {
            InterpolationPath.Count = InterpolationPath.Count - 1;
          }
          ViewPath[0].Z = (local_98->Old).Pos.Z;
          ViewPath[0].X = (local_98->Old).Pos.X;
          ViewPath[0].Y = (local_98->Old).Pos.Y;
          local_c8.X = ((InterpolationPath.Array)->pos).X - ViewPath[0].X;
          local_c8.Y = ((InterpolationPath.Array)->pos).Y - ViewPath[0].Y;
          pTVar9 = TVector2<double>::MakeResize((TVector2<double> *)&local_c8,local_108);
          ViewPath[1].Z = ViewPath[0].Z;
          dVar21 = pTVar9->Y + ViewPath[0].Y;
          ViewPath[1].Y._0_4_ = SUB84(dVar21,0);
          ViewPath[1].X = pTVar9->X + ViewPath[0].X;
          ViewPath[1].Y._4_4_ = (int)((ulong)dVar21 >> 0x20);
        }
        goto LAB_004705f6;
      }
    }
    else {
      dVar20 = (iview->Old).Pos.Y;
      pdVar12 = &(iview->New).Pos.Y;
      if ((dVar20 != *pdVar12) || (NAN(dVar20) || NAN(*pdVar12))) goto LAB_004701df;
    }
    dVar20 = 0.0;
    dVar19 = 0.0;
    if (iVar6 != iVar5) {
      dVar20 = Displacements.data.Array[iVar5 * Displacements.size + iVar6].pos.X;
      dVar19 = Displacements.data.Array[iVar5 * Displacements.size + iVar6].pos.Y;
    }
    dVar3 = (iview->Old).Pos.Z;
    dVar4 = (iview->Old).Pos.Y;
    ViewPath[0].Y = (iview->New).Pos.Y;
    ViewPath[0].Z = (iview->New).Pos.Z;
    ViewPath[1].Y = ViewPath[0].Y;
    ViewPath[1].X = (double)local_78._0_8_;
    ViewPos.Z = (ViewPath[0].Z - dVar3) * (double)local_d8._0_8_ + dVar3;
    ViewPos.Y = ((ViewPath[0].Y - dVar4) - dVar19) * (double)local_d8._0_8_ + dVar4;
    ViewPos.X = (((double)local_78._0_8_ - dVar21) - dVar20) * (double)local_d8._0_8_ + dVar21;
    ViewPath[0].X = (double)local_78._0_8_;
    ViewPath[1].Z = ViewPath[0].Z;
  }
  else {
    ViewPos.Z = (iview->New).Pos.Z;
    piVar2 = &iview->New;
    ViewPath[0].Y = (iview->New).Pos.Y;
    ViewPath[1].X = (piVar2->Pos).X;
    ViewPath[1].Y = (piVar2->Pos).Y;
    ViewPos.X = (piVar2->Pos).X;
    ViewPos.Y = (piVar2->Pos).Y;
    ViewPath[0].X = (piVar2->Pos).X;
    ViewPath[0].Z = ViewPos.Z;
    ViewPath[1].Z = ViewPos.Z;
  }
LAB_004705f6:
  if ((((player != (player_t *)0x0) && (((uint)player->cheats >> 0xe & 1) == 0)) &&
      ((long)&player[-0x916e].morphTics / 0x2a0 == (long)consoleplayer)) &&
     (((APlayerPawn *)camera == player->mo && (demoplayback == false)))) {
    dVar21 = (iview->New).Pos.X;
    if ((dVar21 == (camera->__Pos).X) &&
       ((!NAN(dVar21) && !NAN((camera->__Pos).X) && ((player->cheats & 0x1040U) == 0)))) {
      dVar21 = (iview->New).Pos.Y;
      pdVar12 = &(camera->__Pos).Y;
      if ((dVar21 == *pdVar12) &&
         (((((!NAN(dVar21) && !NAN(*pdVar12) && (player->playerstate == '\0')) &&
            ((player->mo->super_AActor).reactiontime == 0)) &&
           (((NoInterpolateView == false && (paused == 0)) &&
            ((netgame != true || (cl_noprediction.Value == false)))))) &&
          (LocalKeyboardTurner == false)))) {
        iVar6 = SUB84((local_f8 +
                      (double)((ulong)LocalViewAngle._2_2_ << 0x10) * 8.381903171539307e-08) *
                      11930464.711111112 + 6755399441055744.0,0);
        dVar21 = 0.0;
        if (player->centering == false) {
          dVar21 = (double)(int)((uint)LocalViewPitch._2_2_ << 0x10) * 8.381903171539307e-08;
        }
        dVar19 = (double)SUB84(((iview->New).Angles.Pitch.Degrees - dVar21) * 11930464.711111112 +
                               6755399441055744.0,0) * 8.381903171539307e-08;
        dVar21 = (player->MinPitch).Degrees;
        dVar20 = (player->MaxPitch).Degrees;
        uVar15 = -(ulong)(dVar20 <= dVar19);
        uVar16 = -(ulong)(dVar21 < dVar19);
        ViewPitch.Degrees =
             (double)(~uVar16 & (ulong)dVar21 |
                     (uVar15 & (ulong)dVar20 | ~uVar15 & (ulong)dVar19) & uVar16);
        dVar21 = (iview->New).Angles.Roll.Degrees;
        goto LAB_00470754;
      }
    }
  }
  dVar21 = (iview->Old).Angles.Pitch.Degrees;
  ViewPitch.Degrees =
       (double)SUB84(((double)SUB84(((iview->New).Angles.Pitch.Degrees - dVar21) *
                                    11930464.711111112 + 6755399441055744.0,0) *
                      8.381903171539307e-08 * (double)local_d8._0_8_ + dVar21) * 11930464.711111112
                     + 6755399441055744.0,0) * 8.381903171539307e-08;
  iVar6 = SUB84(((double)SUB84((local_f8 - local_100) * 11930464.711111112 + 6755399441055744.0,0) *
                 8.381903171539307e-08 * (double)local_d8._0_8_ + local_100) * 11930464.711111112 +
                6755399441055744.0,0);
  dVar21 = (iview->Old).Angles.Roll.Degrees;
  dVar21 = (double)SUB84(((iview->New).Angles.Roll.Degrees - dVar21) * 11930464.711111112 +
                         6755399441055744.0,0) * 8.381903171539307e-08 * (double)local_d8._0_8_ +
           dVar21;
LAB_00470754:
  ViewAngle.Degrees = (double)iVar6 * 8.381903171539307e-08;
  ViewRoll.Degrees =
       (double)SUB84(dVar21 * 11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
  local_78._0_8_ = ViewPos.X;
  local_78._8_8_ = ViewPos.Y;
  psVar7 = R_PointInSubsector((DVector2 *)local_78);
  viewsector = (sector_t *)psVar7->sector;
  bVar10 = false;
  while (((((sector_t_conflict *)viewsector)->planes[1].Flags & 0x1d0U) == 0x100 &&
         (sectorPortals.Array[((sector_t_conflict *)viewsector)->Portals[1]].mPlaneZ <= ViewPos.Z &&
          ViewPos.Z != sectorPortals.Array[((sector_t_conflict *)viewsector)->Portals[1]].mPlaneZ)))
  {
    dVar21 = sectorPortals.Array[((sector_t_conflict *)viewsector)->Portals[1]].mDisplacement.X +
             ViewPos.X;
    dVar20 = sectorPortals.Array[((sector_t_conflict *)viewsector)->Portals[1]].mDisplacement.Y +
             ViewPos.Y;
    uVar17 = SUB84(dVar20,0);
    uVar18 = (undefined4)((ulong)dVar20 >> 0x20);
    ViewPos.Y._0_4_ = uVar17;
    ViewPos.X = dVar21;
    ViewPos.Y._4_4_ = uVar18;
    local_78._8_4_ = uVar17;
    local_78._0_8_ = dVar21;
    local_78._12_4_ = uVar18;
    psVar7 = R_PointInSubsector((DVector2 *)local_78);
    viewsector = (sector_t *)psVar7->sector;
    bVar10 = true;
  }
  if (!bVar10) {
    while ((viewsector->planes[0].Flags & 0x1d0U) == 0x100) {
      if (sectorPortals.Array[viewsector->Portals[0]].mPlaneZ <= ViewPos.Z) {
        return;
      }
      dVar21 = sectorPortals.Array[viewsector->Portals[0]].mDisplacement.X + ViewPos.X;
      dVar20 = sectorPortals.Array[viewsector->Portals[0]].mDisplacement.Y + ViewPos.Y;
      uVar17 = SUB84(dVar20,0);
      uVar18 = (undefined4)((ulong)dVar20 >> 0x20);
      ViewPos.Y._0_4_ = uVar17;
      ViewPos.X = dVar21;
      ViewPos.Y._4_4_ = uVar18;
      local_78._8_4_ = uVar17;
      local_78._0_8_ = dVar21;
      local_78._12_4_ = uVar18;
      psVar7 = R_PointInSubsector((DVector2 *)local_78);
      viewsector = (sector_t *)psVar7->sector;
    }
  }
  return;
}

Assistant:

void R_InterpolateView (player_t *player, double Frac, InterpolationViewer *iview)
{
	if (NoInterpolateView)
	{
		InterpolationPath.Clear();
		NoInterpolateView = false;
		iview->Old = iview->New;
	}
	int oldgroup = R_PointInSubsector(iview->Old.Pos)->sector->PortalGroup;
	int newgroup = R_PointInSubsector(iview->New.Pos)->sector->PortalGroup;

	DAngle oviewangle = iview->Old.Angles.Yaw;
	DAngle nviewangle = iview->New.Angles.Yaw;
	if (!cl_capfps)
	{
		if ((iview->Old.Pos.X != iview->New.Pos.X || iview->Old.Pos.Y != iview->New.Pos.Y) && InterpolationPath.Size() > 0)
		{
			DVector3 view = iview->New.Pos;

			// Interpolating through line portals is a messy affair.
			// What needs be done is to store the portal transitions of the camera actor as waypoints
			// and then find out on which part of the path the current view lies.
			// Needless to say, this doesn't work for chasecam mode.
			if (!r_showviewer)
			{
				double pathlen = 0;
				double zdiff = 0;
				double totalzdiff = 0;
				DAngle adiff = 0.;
				DAngle totaladiff = 0.;
				double oviewz = iview->Old.Pos.Z;
				double nviewz = iview->New.Pos.Z;
				DVector3a oldpos = { { iview->Old.Pos.X, iview->Old.Pos.Y, 0 }, 0. };
				DVector3a newpos = { { iview->New.Pos.X, iview->New.Pos.Y, 0 }, 0. };
				InterpolationPath.Push(newpos);	// add this to  the array to simplify the loops below

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					pathlen += (end.pos - start.pos).Length();
					totalzdiff += start.pos.Z;
					totaladiff += start.angle;
				}
				double interpolatedlen = Frac * pathlen;

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					double fraglen = (end.pos - start.pos).Length();
					zdiff += start.pos.Z;
					adiff += start.angle;
					if (fraglen <= interpolatedlen)
					{
						interpolatedlen -= fraglen;
					}
					else
					{
						double fragfrac = interpolatedlen / fraglen;
						oviewz += zdiff;
						nviewz -= totalzdiff - zdiff;
						oviewangle += adiff;
						nviewangle -= totaladiff - adiff;
						DVector2 viewpos = start.pos + (fragfrac * (end.pos - start.pos));
						ViewPos = { viewpos, oviewz + Frac * (nviewz - oviewz) };
						break;
					}
				}
				InterpolationPath.Pop();
				ViewPath[0] = iview->Old.Pos;
				ViewPath[1] = ViewPath[0] + (InterpolationPath[0].pos - ViewPath[0]).XY().MakeResize(pathlen);
			}
		}
		else
		{
			DVector2 disp = Displacements.getOffset(oldgroup, newgroup);
			ViewPos = iview->Old.Pos + (iview->New.Pos - iview->Old.Pos - disp) * Frac;
			ViewPath[0] = ViewPath[1] = iview->New.Pos;
		}
	}
	else
	{
		ViewPos = iview->New.Pos;
		ViewPath[0] = ViewPath[1] = iview->New.Pos;
	}
	if (player != NULL &&
		!(player->cheats & CF_INTERPVIEW) &&
		player - players == consoleplayer &&
		camera == player->mo &&
		!demoplayback &&
		iview->New.Pos.X == camera->X() &&
		iview->New.Pos.Y == camera->Y() && 
		!(player->cheats & (CF_TOTALLYFROZEN|CF_FROZEN)) &&
		player->playerstate == PST_LIVE &&
		player->mo->reactiontime == 0 &&
		!NoInterpolateView &&
		!paused &&
		(!netgame || !cl_noprediction) &&
		!LocalKeyboardTurner)
	{
		ViewAngle = (nviewangle + AngleToFloat(LocalViewAngle & 0xFFFF0000)).Normalized180();
		DAngle delta = player->centering ? DAngle(0.) : AngleToFloat(int(LocalViewPitch & 0xFFFF0000));
		ViewPitch = clamp<DAngle>((iview->New.Angles.Pitch - delta).Normalized180(), player->MinPitch, player->MaxPitch);
		ViewRoll = iview->New.Angles.Roll.Normalized180();
	}
	else
	{
		ViewPitch = (iview->Old.Angles.Pitch + deltaangle(iview->Old.Angles.Pitch, iview->New.Angles.Pitch) * Frac).Normalized180();
		ViewAngle = (oviewangle + deltaangle(oviewangle, nviewangle) * Frac).Normalized180();
		ViewRoll = (iview->Old.Angles.Roll + deltaangle(iview->Old.Angles.Roll, iview->New.Angles.Roll) * Frac).Normalized180();
	}
	
	// Due to interpolation this is not necessarily the same as the sector the camera is in.
	viewsector = R_PointInSubsector(ViewPos)->sector;
	bool moved = false;
	while (!viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		if (ViewPos.Z > viewsector->GetPortalPlaneZ(sector_t::ceiling))
		{
			ViewPos += viewsector->GetPortalDisplacement(sector_t::ceiling);
			viewsector = R_PointInSubsector(ViewPos)->sector;
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!viewsector->PortalBlocksMovement(sector_t::floor))
		{
			if (ViewPos.Z < viewsector->GetPortalPlaneZ(sector_t::floor))
			{
				ViewPos += viewsector->GetPortalDisplacement(sector_t::floor);
				viewsector = R_PointInSubsector(ViewPos)->sector;
				moved = true;
			}
			else break;
		}
	}
}